

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

UInt32 __thiscall testing::internal::Random::Generate(Random *this,UInt32 range)

{
  bool bVar1;
  ostream *poVar2;
  GTestLog local_28 [4];
  GTestLog local_18;
  UInt32 local_14;
  Random *pRStack_10;
  UInt32 range_local;
  Random *this_local;
  
  this->state_ = (this->state_ * 0x41c64e6d + 0x3039) % 0x80000000;
  local_14 = range;
  pRStack_10 = this;
  bVar1 = IsTrue(range != 0);
  if (!bVar1) {
    GTestLog::GTestLog(&local_18,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/build_O0/_deps/googletest-src/googletest/src/gtest.cc"
                       ,0x152);
    poVar2 = GTestLog::GetStream(&local_18);
    poVar2 = std::operator<<(poVar2,"Condition range > 0 failed. ");
    std::operator<<(poVar2,"Cannot generate a number in the range [0, 0).");
    GTestLog::~GTestLog(&local_18);
  }
  bVar1 = IsTrue(local_14 < 0x80000001);
  if (!bVar1) {
    GTestLog::GTestLog(local_28,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/build_O0/_deps/googletest-src/googletest/src/gtest.cc"
                       ,0x154);
    poVar2 = GTestLog::GetStream(local_28);
    poVar2 = std::operator<<(poVar2,"Condition range <= kMaxRange failed. ");
    poVar2 = std::operator<<(poVar2,"Generation of a number in [0, ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_14);
    poVar2 = std::operator<<(poVar2,") was requested, ");
    poVar2 = std::operator<<(poVar2,"but this can only generate numbers in [0, ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x80000000);
    std::operator<<(poVar2,").");
    GTestLog::~GTestLog(local_28);
  }
  return this->state_ % local_14;
}

Assistant:

UInt32 Random::Generate(UInt32 range) {
  // These constants are the same as are used in glibc's rand(3).
  // Use wider types than necessary to prevent unsigned overflow diagnostics.
  state_ = static_cast<UInt32>(1103515245ULL*state_ + 12345U) % kMaxRange;

  GTEST_CHECK_(range > 0)
      << "Cannot generate a number in the range [0, 0).";
  GTEST_CHECK_(range <= kMaxRange)
      << "Generation of a number in [0, " << range << ") was requested, "
      << "but this can only generate numbers in [0, " << kMaxRange << ").";

  // Converting via modulus introduces a bit of downward bias, but
  // it's simple, and a linear congruential generator isn't too good
  // to begin with.
  return state_ % range;
}